

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Transpose::forward_impl
          (Transpose *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  Tensor *pTVar9;
  ulong uVar10;
  uint uVar11;
  Index col;
  float *pfVar12;
  Index row;
  ulong uVar13;
  uint uVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  int iVar25;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_50;
  
  if ((((this->super_Node).dim.d[0] == 1) || ((this->super_Node).dim.nd < 2)) ||
     ((this->super_Node).dim.d[1] == 1)) {
    fx->v = (*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->v;
  }
  else {
    pTVar9 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar11 = (pTVar9->d).bd;
    if (uVar11 != 0) {
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = 0;
      do {
        uVar1 = (pTVar9->d).nd;
        iVar24 = 1;
        if ((ulong)uVar1 != 0) {
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar20 = vpbroadcastq_avx512f();
          uVar10 = 0;
          do {
            auVar21 = vpbroadcastq_avx512f();
            auVar22 = vmovdqa64_avx512f(auVar19);
            auVar19 = vporq_avx512f(auVar21,auVar17);
            auVar21 = vporq_avx512f(auVar21,auVar18);
            uVar6 = vpcmpuq_avx512f(auVar21,auVar20,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar19,auVar20,2);
            bVar8 = (byte)uVar6;
            uVar15 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar9->d).d + uVar10));
            auVar21._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar19._4_4_;
            auVar21._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar21._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar19._8_4_;
            auVar21._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar19._12_4_;
            auVar21._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar19._16_4_;
            auVar21._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar19._20_4_;
            auVar21._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar19._24_4_;
            auVar21._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar19._28_4_;
            auVar21._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar21._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar21._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar21._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar21._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar21._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar21._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar21._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            uVar10 = uVar10 + 0x10;
            auVar19 = vpmulld_avx512f(auVar21,auVar22);
          } while (((ulong)uVar1 + 0xf & 0x1fffffff0) != uVar10);
          auVar19 = vmovdqa32_avx512f(auVar19);
          auVar20._0_4_ =
               (uint)(bVar7 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._0_4_;
          bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar20._4_4_ = (uint)bVar3 * auVar19._4_4_ | (uint)!bVar3 * auVar22._4_4_;
          bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar20._8_4_ = (uint)bVar3 * auVar19._8_4_ | (uint)!bVar3 * auVar22._8_4_;
          bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar20._12_4_ = (uint)bVar3 * auVar19._12_4_ | (uint)!bVar3 * auVar22._12_4_;
          bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar20._16_4_ = (uint)bVar3 * auVar19._16_4_ | (uint)!bVar3 * auVar22._16_4_;
          bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar20._20_4_ = (uint)bVar3 * auVar19._20_4_ | (uint)!bVar3 * auVar22._20_4_;
          bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar20._24_4_ = (uint)bVar3 * auVar19._24_4_ | (uint)!bVar3 * auVar22._24_4_;
          bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
          auVar20._28_4_ = (uint)bVar3 * auVar19._28_4_ | (uint)!bVar3 * auVar22._28_4_;
          auVar20._32_4_ =
               (uint)(bVar8 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar20._36_4_ = (uint)bVar3 * auVar19._36_4_ | (uint)!bVar3 * auVar22._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar20._40_4_ = (uint)bVar3 * auVar19._40_4_ | (uint)!bVar3 * auVar22._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar20._44_4_ = (uint)bVar3 * auVar19._44_4_ | (uint)!bVar3 * auVar22._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar20._48_4_ = (uint)bVar3 * auVar19._48_4_ | (uint)!bVar3 * auVar22._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar20._52_4_ = (uint)bVar3 * auVar19._52_4_ | (uint)!bVar3 * auVar22._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar20._56_4_ = (uint)bVar3 * auVar19._56_4_ | (uint)!bVar3 * auVar22._56_4_;
          auVar20._60_4_ =
               (uint)(bVar8 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar22._60_4_;
          auVar16 = vextracti64x4_avx512f(auVar20,1);
          auVar19 = vpmulld_avx512f(auVar20,ZEXT3264(auVar16));
          auVar4 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          iVar24 = auVar4._0_4_;
        }
        iVar25 = 1;
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar9->v + (uVar14 % uVar11) * iVar24;
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(pTVar9->d).d[0];
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar9->d).d[1];
        if (uVar1 < 2) {
          local_50.m_matrix.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        uVar11 = (fx->d).nd;
        if ((ulong)uVar11 != 0) {
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar20 = vpbroadcastq_avx512f();
          uVar10 = 0;
          do {
            auVar21 = vpbroadcastq_avx512f();
            auVar22 = vmovdqa64_avx512f(auVar19);
            auVar19 = vporq_avx512f(auVar21,auVar17);
            auVar21 = vporq_avx512f(auVar21,auVar18);
            uVar6 = vpcmpuq_avx512f(auVar21,auVar20,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar19,auVar20,2);
            bVar8 = (byte)uVar6;
            uVar15 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
            auVar23._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar19._4_4_;
            auVar23._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar23._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar19._8_4_;
            auVar23._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar19._12_4_;
            auVar23._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar19._16_4_;
            auVar23._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar19._20_4_;
            auVar23._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar19._24_4_;
            auVar23._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar19._28_4_;
            auVar23._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar23._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar23._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar23._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar23._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar23._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar23._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar23._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            uVar10 = uVar10 + 0x10;
            auVar19 = vpmulld_avx512f(auVar23,auVar22);
          } while (((ulong)uVar11 + 0xf & 0x1fffffff0) != uVar10);
          auVar17 = vmovdqa32_avx512f(auVar19);
          auVar18._0_4_ =
               (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._0_4_;
          bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar18._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar22._4_4_;
          bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar18._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar22._8_4_;
          bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar18._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar22._12_4_;
          bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar18._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * auVar22._16_4_;
          bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar18._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * auVar22._20_4_;
          bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar18._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * auVar22._24_4_;
          bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
          auVar18._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * auVar22._28_4_;
          auVar18._32_4_ =
               (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar22._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar18._36_4_ = (uint)bVar3 * auVar17._36_4_ | (uint)!bVar3 * auVar22._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar18._40_4_ = (uint)bVar3 * auVar17._40_4_ | (uint)!bVar3 * auVar22._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar18._44_4_ = (uint)bVar3 * auVar17._44_4_ | (uint)!bVar3 * auVar22._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar18._48_4_ = (uint)bVar3 * auVar17._48_4_ | (uint)!bVar3 * auVar22._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar18._52_4_ = (uint)bVar3 * auVar17._52_4_ | (uint)!bVar3 * auVar22._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar18._56_4_ = (uint)bVar3 * auVar17._56_4_ | (uint)!bVar3 * auVar22._56_4_;
          auVar18._60_4_ =
               (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar22._60_4_;
          auVar16 = vextracti64x4_avx512f(auVar18,1);
          auVar17 = vpmulld_avx512f(auVar18,ZEXT3264(auVar16));
          auVar4 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          iVar25 = auVar4._0_4_;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = fx->v + (uVar14 % (fx->d).bd) * iVar25;
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(fx->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(fx->d).d[1];
        if (uVar11 < 2) {
          local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        Eigen::internal::
        check_for_aliasing<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>>
                  (&local_70,&local_50);
        if ((local_70.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value !=
             local_50.m_matrix.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value) ||
           (local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value !=
            local_50.m_matrix.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                       );
        }
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (0 < local_50.m_matrix.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value) {
          uVar10 = 0;
          do {
            if (0 < local_50.m_matrix.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value) {
              uVar13 = 0;
              pfVar12 = local_50.m_matrix.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
              do {
                fVar2 = *pfVar12;
                pfVar12 = pfVar12 + local_50.m_matrix.
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                    .
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                    .m_rows.m_value;
                local_70.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data[uVar13] = fVar2;
                uVar13 = uVar13 + 1;
              } while (local_50.m_matrix.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_cols.m_value != uVar13);
            }
            uVar10 = uVar10 + 1;
            local_50.m_matrix.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_50.m_matrix.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data + 1;
            local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_70.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data + local_50.m_matrix.
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_cols.m_value;
          } while (uVar10 != local_50.m_matrix.
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_rows.m_value);
        }
        uVar14 = uVar14 + 1;
        pTVar9 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (pTVar9->d).bd;
      } while (uVar14 < uVar11);
    }
  }
  return;
}

Assistant:

void Transpose::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (dim.rows() == 1 || dim.cols() == 1) {
    fx.v = xs[0]->v;
  } else {
#if HAVE_CUDA
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      CUBLAS_CHECK(cublasSgeam(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N, fx.d.rows(), fx.d.cols(),
                               kSCALAR_ONE, xs[0]->batch_ptr(b), xs[0]->d.rows(), kSCALAR_ZERO, NULL, fx.d.rows(), fx.batch_ptr(b), fx.d.rows()));
#else
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b).transpose();
#endif
  }
}